

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_glsl.cpp
# Opt level: O0

void __thiscall
diligent_spirv_cross::CompilerGLSL::emit_unrolled_unary_op
          (CompilerGLSL *this,uint32_t result_type,uint32_t result_id,uint32_t operand,char *op)

{
  bool forwarding;
  string local_80;
  uint local_60;
  uint32_t i;
  undefined1 local_50 [8];
  string expr;
  SPIRType *type;
  char *op_local;
  uint32_t operand_local;
  uint32_t result_id_local;
  uint32_t result_type_local;
  CompilerGLSL *this_local;
  
  expr.field_2._8_8_ =
       Compiler::get<diligent_spirv_cross::SPIRType>(&this->super_Compiler,result_type);
  type_to_glsl_constructor_abi_cxx11_((string *)local_50,this,(SPIRType *)expr.field_2._8_8_);
  ::std::__cxx11::string::operator+=((string *)local_50,'(');
  for (local_60 = 0; local_60 < *(uint *)(expr.field_2._8_8_ + 0x18); local_60 = local_60 + 1) {
    ::std::__cxx11::string::operator+=((string *)local_50,op);
    to_extract_component_expression_abi_cxx11_(&local_80,this,operand,local_60);
    ::std::__cxx11::string::operator+=((string *)local_50,(string *)&local_80);
    ::std::__cxx11::string::~string((string *)&local_80);
    if (local_60 + 1 < *(uint *)(expr.field_2._8_8_ + 0x18)) {
      ::std::__cxx11::string::operator+=((string *)local_50,", ");
    }
  }
  ::std::__cxx11::string::operator+=((string *)local_50,')');
  forwarding = should_forward(this,operand);
  emit_op(this,result_type,result_id,(string *)local_50,forwarding,false);
  Compiler::inherit_expression_dependencies(&this->super_Compiler,result_id,operand);
  ::std::__cxx11::string::~string((string *)local_50);
  return;
}

Assistant:

void CompilerGLSL::emit_unrolled_unary_op(uint32_t result_type, uint32_t result_id, uint32_t operand, const char *op)
{
	auto &type = get<SPIRType>(result_type);
	auto expr = type_to_glsl_constructor(type);
	expr += '(';
	for (uint32_t i = 0; i < type.vecsize; i++)
	{
		// Make sure to call to_expression multiple times to ensure
		// that these expressions are properly flushed to temporaries if needed.
		expr += op;
		expr += to_extract_component_expression(operand, i);

		if (i + 1 < type.vecsize)
			expr += ", ";
	}
	expr += ')';
	emit_op(result_type, result_id, expr, should_forward(operand));

	inherit_expression_dependencies(result_id, operand);
}